

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

int __thiscall Fl::copy(Fl *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  undefined8 in_RAX;
  char *__dest;
  int iVar2;
  Atom AVar3;
  
  iVar1 = (int)src;
  iVar2 = (int)dst;
  if (iVar2 < 0 || this == (Fl *)0x0) {
    return (int)CONCAT71((int7)((ulong)in_RAX >> 8),this == (Fl *)0x0);
  }
  if (1 < iVar1) {
    copy(this,(EVP_PKEY_CTX *)((ulong)dst & 0xffffffff),(EVP_PKEY_CTX *)0x0);
    iVar1 = 1;
  }
  __dest = fl_selection_buffer[iVar1];
  if (fl_selection_buffer_length[iVar1] <= iVar2) {
    if (__dest != (char *)0x0) {
      operator_delete__(__dest);
    }
    __dest = (char *)operator_new__((ulong)(iVar2 + 100U));
    fl_selection_buffer[iVar1] = __dest;
    fl_selection_buffer_length[iVar1] = iVar2 + 100U;
  }
  memcpy(__dest,this,(ulong)dst & 0xffffffff);
  fl_selection_buffer[iVar1][(ulong)dst & 0xffffffff] = '\0';
  fl_selection_length[iVar1] = iVar2;
  fl_i_own_selection[iVar1] = '\x01';
  fl_selection_type[iVar1] = "text/plain";
  AVar3 = 1;
  if (iVar1 != 0) {
    AVar3 = CLIPBOARD;
  }
  iVar1 = XSetSelectionOwner(fl_display,AVar3,fl_message_window,fl_event_time);
  return iVar1;
}

Assistant:

void Fl::copy(const char *stuff, int len, int clipboard, const char *type) {
  if (!stuff || len<0) return;

  if (clipboard >= 2) {
    copy(stuff, len, 0, type);
    copy(stuff, len, 1, type);
    return;
  }

  if (len+1 > fl_selection_buffer_length[clipboard]) {
    delete[] fl_selection_buffer[clipboard];
    fl_selection_buffer[clipboard] = new char[len+100];
    fl_selection_buffer_length[clipboard] = len+100;
  }
  memcpy(fl_selection_buffer[clipboard], stuff, len);
  fl_selection_buffer[clipboard][len] = 0; // needed for direct paste
  fl_selection_length[clipboard] = len;
  fl_i_own_selection[clipboard] = 1;
  fl_selection_type[clipboard] = Fl::clipboard_plain_text;
  Atom property = clipboard ? CLIPBOARD : XA_PRIMARY;
  XSetSelectionOwner(fl_display, property, fl_message_window, fl_event_time);
}